

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O0

int32_t uloc_toLanguageTag_63
                  (char *localeID,char *langtag,int32_t langtagCapacity,UBool strict,
                  UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  UEnumeration *en;
  bool bVar6;
  undefined1 local_128;
  undefined1 local_127;
  char local_126 [6];
  char buf [100];
  int32_t len;
  char *key;
  UBool done;
  int kwdCnt;
  UEnumeration *kwdEnum;
  char *buffer;
  char *pcStack_88;
  int32_t resultCapacity;
  char *pKeywordStart;
  UErrorCode local_78;
  int iStack_74;
  UBool hadPosix;
  UErrorCode tmpStatus;
  int32_t reslen;
  CharString canonical;
  UErrorCode *status_local;
  UBool strict_local;
  int32_t langtagCapacity_local;
  char *langtag_local;
  char *localeID_local;
  
  canonical._56_8_ = status;
  icu_63::CharString::CharString((CharString *)&tmpStatus);
  local_78 = U_ZERO_ERROR;
  pKeywordStart._7_1_ = '\0';
  sVar3 = strlen(localeID);
  buffer._4_4_ = (int32_t)sVar3;
  if (buffer._4_4_ < 1) {
LAB_003b26f0:
    iStack_74 = 0;
    pcVar4 = icu_63::CharString::data((CharString *)&tmpStatus);
    pcVar4 = locale_getKeywordsStart_63(pcVar4);
    pcStack_88 = pcVar4;
    pcVar5 = icu_63::CharString::data((CharString *)&tmpStatus);
    if (pcVar4 == pcVar5) {
      bVar6 = false;
      pcVar4 = icu_63::CharString::data((CharString *)&tmpStatus);
      en = uloc_openKeywords_63(pcVar4,&local_78);
      if (en != (UEnumeration *)0x0) {
        iVar2 = uenum_count_63(en,&local_78);
        if (iVar2 == 1) {
          buf[0x5c] = '\0';
          buf[0x5d] = '\0';
          buf[0x5e] = '\0';
          buf[0x5f] = '\0';
          register0x00000000 = uenum_next_63(en,(int32_t *)(buf + 0x5c),&local_78);
          if ((buf._92_4_ == 1) && (*register0x00000000 == 'x')) {
            local_128 = 0x78;
            local_127 = 0x2d;
            buf._92_4_ = uloc_getKeywordValue_63
                                   (localeID,register0x00000000,local_126,0x62,&local_78);
            UVar1 = U_SUCCESS(local_78);
            if (UVar1 == '\0') {
              *(undefined4 *)canonical._56_8_ = 1;
              bVar6 = true;
            }
            else {
              UVar1 = _isPrivateuseValueSubtags(local_126,buf._92_4_);
              if (UVar1 == '\0') {
                bVar6 = strict != '\0';
                if (bVar6) {
                  *(undefined4 *)canonical._56_8_ = 1;
                }
              }
              else {
                iStack_74 = buf._92_4_ + 2;
                iVar2 = uprv_min_63(iStack_74,langtagCapacity);
                memcpy(langtag,&local_128,(long)iVar2);
                u_terminateChars_63(langtag,langtagCapacity,iStack_74,(UErrorCode *)canonical._56_8_
                                   );
                bVar6 = true;
              }
            }
          }
        }
        uenum_close_63(en);
        if (bVar6) {
          localeID_local._4_4_ = iStack_74;
          goto LAB_003b2b79;
        }
      }
    }
    pcVar4 = icu_63::CharString::data((CharString *)&tmpStatus);
    iVar2 = _appendLanguageToLanguageTag
                      (pcVar4,langtag,langtagCapacity,strict,(UErrorCode *)canonical._56_8_);
    iStack_74 = iStack_74 + iVar2;
    pcVar4 = icu_63::CharString::data((CharString *)&tmpStatus);
    iVar2 = _appendScriptToLanguageTag
                      (pcVar4,langtag + iStack_74,langtagCapacity - iStack_74,strict,
                       (UErrorCode *)canonical._56_8_);
    iStack_74 = iStack_74 + iVar2;
    pcVar4 = icu_63::CharString::data((CharString *)&tmpStatus);
    iVar2 = _appendRegionToLanguageTag
                      (pcVar4,langtag + iStack_74,langtagCapacity - iStack_74,strict,
                       (UErrorCode *)canonical._56_8_);
    iStack_74 = iStack_74 + iVar2;
    pcVar4 = icu_63::CharString::data((CharString *)&tmpStatus);
    iVar2 = _appendVariantsToLanguageTag
                      (pcVar4,langtag + iStack_74,langtagCapacity - iStack_74,strict,
                       (UBool *)((long)&pKeywordStart + 7),(UErrorCode *)canonical._56_8_);
    iStack_74 = iStack_74 + iVar2;
    pcVar4 = icu_63::CharString::data((CharString *)&tmpStatus);
    iVar2 = _appendKeywordsToLanguageTag
                      (pcVar4,langtag + iStack_74,langtagCapacity - iStack_74,strict,
                       pKeywordStart._7_1_,(UErrorCode *)canonical._56_8_);
    iStack_74 = iStack_74 + iVar2;
    pcVar4 = icu_63::CharString::data((CharString *)&tmpStatus);
    iVar2 = _appendPrivateuseToLanguageTag
                      (pcVar4,langtag + iStack_74,langtagCapacity - iStack_74,strict,
                       pKeywordStart._7_1_,(UErrorCode *)canonical._56_8_);
    iStack_74 = iVar2 + iStack_74;
    localeID_local._4_4_ = iStack_74;
  }
  else {
    while( true ) {
      pcVar4 = icu_63::CharString::getAppendBuffer
                         ((CharString *)&tmpStatus,buffer._4_4_,buffer._4_4_,
                          (int32_t *)((long)&buffer + 4),&local_78);
      UVar1 = U_FAILURE(local_78);
      if (UVar1 != '\0') break;
      iStack_74 = uloc_canonicalize_63(localeID,pcVar4,buffer._4_4_,&local_78);
      if (local_78 != U_BUFFER_OVERFLOW_ERROR) {
        UVar1 = U_FAILURE(local_78);
        if (UVar1 != '\0') {
          *(undefined4 *)canonical._56_8_ = 1;
          localeID_local._4_4_ = 0;
          goto LAB_003b2b79;
        }
        icu_63::CharString::append((CharString *)&tmpStatus,pcVar4,iStack_74,&local_78);
        if (local_78 == U_STRING_NOT_TERMINATED_WARNING) {
          local_78 = U_ZERO_ERROR;
        }
        UVar1 = U_FAILURE(local_78);
        if (UVar1 == '\0') goto LAB_003b26f0;
        *(UErrorCode *)canonical._56_8_ = local_78;
        localeID_local._4_4_ = 0;
        goto LAB_003b2b79;
      }
      local_78 = U_ZERO_ERROR;
      buffer._4_4_ = iStack_74;
    }
    *(UErrorCode *)canonical._56_8_ = local_78;
    localeID_local._4_4_ = 0;
  }
LAB_003b2b79:
  icu_63::CharString::~CharString((CharString *)&tmpStatus);
  return localeID_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_toLanguageTag(const char* localeID,
                   char* langtag,
                   int32_t langtagCapacity,
                   UBool strict,
                   UErrorCode* status) {
    icu::CharString canonical;
    int32_t reslen;
    UErrorCode tmpStatus = U_ZERO_ERROR;
    UBool hadPosix = FALSE;
    const char* pKeywordStart;

    /* Note: uloc_canonicalize returns "en_US_POSIX" for input locale ID "".  See #6835 */
    int32_t resultCapacity = static_cast<int32_t>(uprv_strlen(localeID));
    if (resultCapacity > 0) {
        char* buffer;

        for (;;) {
            buffer = canonical.getAppendBuffer(
                    /*minCapacity=*/resultCapacity,
                    /*desiredCapacityHint=*/resultCapacity,
                    resultCapacity,
                    tmpStatus);

            if (U_FAILURE(tmpStatus)) {
                *status = tmpStatus;
                return 0;
            }

            reslen =
                uloc_canonicalize(localeID, buffer, resultCapacity, &tmpStatus);

            if (tmpStatus != U_BUFFER_OVERFLOW_ERROR) {
                break;
            }

            resultCapacity = reslen;
            tmpStatus = U_ZERO_ERROR;
        }

        if (U_FAILURE(tmpStatus)) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }

        canonical.append(buffer, reslen, tmpStatus);
        if (tmpStatus == U_STRING_NOT_TERMINATED_WARNING) {
            tmpStatus = U_ZERO_ERROR;  // Terminators provided by CharString.
        }

        if (U_FAILURE(tmpStatus)) {
            *status = tmpStatus;
            return 0;
        }
    }

    reslen = 0;

    /* For handling special case - private use only tag */
    pKeywordStart = locale_getKeywordsStart(canonical.data());
    if (pKeywordStart == canonical.data()) {
        UEnumeration *kwdEnum;
        int kwdCnt = 0;
        UBool done = FALSE;

        kwdEnum = uloc_openKeywords(canonical.data(), &tmpStatus);
        if (kwdEnum != NULL) {
            kwdCnt = uenum_count(kwdEnum, &tmpStatus);
            if (kwdCnt == 1) {
                const char *key;
                int32_t len = 0;

                key = uenum_next(kwdEnum, &len, &tmpStatus);
                if (len == 1 && *key == PRIVATEUSE) {
                    char buf[ULOC_KEYWORD_AND_VALUES_CAPACITY];
                    buf[0] = PRIVATEUSE;
                    buf[1] = SEP;
                    len = uloc_getKeywordValue(localeID, key, &buf[2], sizeof(buf) - 2, &tmpStatus);
                    if (U_SUCCESS(tmpStatus)) {
                        if (_isPrivateuseValueSubtags(&buf[2], len)) {
                            /* return private use only tag */
                            reslen = len + 2;
                            uprv_memcpy(langtag, buf, uprv_min(reslen, langtagCapacity));
                            u_terminateChars(langtag, langtagCapacity, reslen, status);
                            done = TRUE;
                        } else if (strict) {
                            *status = U_ILLEGAL_ARGUMENT_ERROR;
                            done = TRUE;
                        }
                        /* if not strict mode, then "und" will be returned */
                    } else {
                        *status = U_ILLEGAL_ARGUMENT_ERROR;
                        done = TRUE;
                    }
                }
            }
            uenum_close(kwdEnum);
            if (done) {
                return reslen;
            }
        }
    }

    reslen += _appendLanguageToLanguageTag(canonical.data(), langtag, langtagCapacity, strict, status);
    reslen += _appendScriptToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, status);
    reslen += _appendRegionToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, status);
    reslen += _appendVariantsToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, &hadPosix, status);
    reslen += _appendKeywordsToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, hadPosix, status);
    reslen += _appendPrivateuseToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, hadPosix, status);

    return reslen;
}